

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_time_timestamp_primitive_microsecondsNow
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  int64_t value;
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 0) {
    sysbvm_error_argumentCountMismatch(0,argumentCount);
  }
  value = sysbvm_time_microsecondsTimestamp();
  sVar1 = sysbvm_tuple_int64_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_time_timestamp_primitive_microsecondsNow(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 0) sysbvm_error_argumentCountMismatch(0, argumentCount);

    return sysbvm_tuple_int64_encode(context, sysbvm_time_microsecondsTimestamp());
}